

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

void __thiscall Indexer::register_dataset(Indexer *this,string *dataset_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  path *in_stack_00000018;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  make_unique<OnDiskDataset,std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&>
            (in_stack_00000018,in_stack_00000010);
  std::
  vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>
  ::emplace_back<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::~unique_ptr
            ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
             in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void Indexer::register_dataset(const std::string &dataset_name) {
    created_datasets.emplace_back(
        std::make_unique<OnDiskDataset>(snap->db_base, dataset_name));
}